

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

HistoryEntry * __thiscall
QTextBrowserPrivate::createHistoryEntry
          (HistoryEntry *__return_storage_ptr__,QTextBrowserPrivate *this)

{
  QUrlPrivate *pQVar1;
  QTextEdit *this_00;
  long lVar2;
  long lVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  bool bVar7;
  char cVar8;
  ResourceType RVar9;
  int iVar10;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 local_48 [16];
  qsizetype local_38;
  QWidgetData *local_28;
  
  local_28 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->type = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->hpos = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->focusIndicatorPosition = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->title).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->title).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->url).d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->title).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&__return_storage_ptr__->url);
  (__return_storage_ptr__->title).d.size = 0;
  __return_storage_ptr__->hpos = 0;
  __return_storage_ptr__->vpos = 0;
  (__return_storage_ptr__->title).d.d = (Data *)0x0;
  (__return_storage_ptr__->title).d.ptr = (char16_t *)0x0;
  __return_storage_ptr__->focusIndicatorPosition = -1;
  __return_storage_ptr__->focusIndicatorAnchor = -1;
  __return_storage_ptr__->type = UnknownResource;
  QTextBrowser::source((QTextBrowser *)local_48);
  pQVar1 = (__return_storage_ptr__->url).d;
  (__return_storage_ptr__->url).d = (QUrlPrivate *)local_48._0_8_;
  local_48._0_8_ = pQVar1;
  QUrl::~QUrl((QUrl *)local_48);
  this_00 = *(QTextEdit **)
             &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
              super_QWidgetPrivate.field_0x8;
  lVar2 = *(long *)&(this_00->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar3 = *(long *)(lVar2 + 0x3d8);
  if (lVar3 == 0) {
    RVar9 = UnknownResource;
  }
  else {
    RVar9 = *(ResourceType *)(*(long *)(lVar2 + 0x3d0) + -8 + lVar3 * 0x38);
  }
  __return_storage_ptr__->type = RVar9;
  QTextEdit::document(this_00);
  QTextDocument::metaInformation((MetaInformation)local_48);
  pQVar4 = &((__return_storage_ptr__->title).d.d)->super_QArrayData;
  pcVar5 = (__return_storage_ptr__->title).d.ptr;
  (__return_storage_ptr__->title).d.d = (Data *)local_48._0_8_;
  (__return_storage_ptr__->title).d.ptr = (char16_t *)local_48._8_8_;
  qVar6 = (__return_storage_ptr__->title).d.size;
  (__return_storage_ptr__->title).d.size = local_38;
  local_48._0_8_ = pQVar4;
  local_48._8_8_ = pcVar5;
  local_38 = qVar6;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  iVar10 = QAbstractSlider::value
                     (&((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                       super_QAbstractSlider);
  __return_storage_ptr__->hpos = iVar10;
  iVar10 = QAbstractSlider::value
                     (&((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                       super_QAbstractSlider);
  __return_storage_ptr__->vpos = iVar10;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor((QWidgetTextControl *)local_48);
  bVar7 = QWidgetTextControl::cursorIsFocusIndicator
                    ((QWidgetTextControl *)(this->super_QTextEditPrivate).control);
  if (bVar7) {
    cVar8 = QTextCursor::hasSelection();
    if (cVar8 != '\0') {
      iVar10 = QTextCursor::position();
      __return_storage_ptr__->focusIndicatorPosition = iVar10;
      iVar10 = QTextCursor::anchor();
      __return_storage_ptr__->focusIndicatorAnchor = iVar10;
    }
  }
  QTextCursor::~QTextCursor((QTextCursor *)local_48);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTextBrowserPrivate::HistoryEntry QTextBrowserPrivate::createHistoryEntry() const
{
    HistoryEntry entry;
    entry.url = q_func()->source();
    entry.type = q_func()->sourceType();
    entry.title = q_func()->documentTitle();
    entry.hpos = hbar->value();
    entry.vpos = vbar->value();

    const QTextCursor cursor = control->textCursor();
    if (control->cursorIsFocusIndicator()
        && cursor.hasSelection()) {

        entry.focusIndicatorPosition = cursor.position();
        entry.focusIndicatorAnchor = cursor.anchor();
    }
    return entry;
}